

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O0

size_t append_random_value_string(char *buffer,size_t size,random_value *rv)

{
  size_t sVar1;
  size_t local_28;
  size_t offset;
  random_value *rv_local;
  size_t size_local;
  char *buffer_local;
  
  local_28 = 0;
  if (((0 < rv->base) && (local_28 = strnfmt(buffer,size,"%d",(ulong)(uint)rv->base), 0 < rv->dice))
     && (0 < rv->sides)) {
    sVar1 = strnfmt(buffer + local_28,size - local_28,"+");
    local_28 = sVar1 + local_28;
  }
  if ((rv->dice == 1) && (0 < rv->sides)) {
    sVar1 = strnfmt(buffer + local_28,size - local_28,"d%d",(ulong)(uint)rv->sides);
    local_28 = sVar1 + local_28;
  }
  else if ((1 < rv->dice) && (0 < rv->sides)) {
    sVar1 = strnfmt(buffer + local_28,size - local_28,"%dd%d",(ulong)(uint)rv->dice,
                    (ulong)(uint)rv->sides);
    local_28 = sVar1 + local_28;
  }
  return local_28;
}

Assistant:

static size_t append_random_value_string(char *buffer, size_t size,
										 random_value *rv)
{
	size_t offset = 0;

	if (rv->base > 0) {
		offset += strnfmt(buffer + offset, size - offset, "%d", rv->base);

		if (rv->dice > 0 && rv->sides > 0) {
			offset += strnfmt(buffer + offset, size - offset, "+");
		}
	}

	if (rv->dice == 1 && rv->sides > 0) {
		offset += strnfmt(buffer + offset, size - offset, "d%d", rv->sides);
	} else if (rv->dice > 1 && rv->sides > 0) {
		offset += strnfmt(buffer + offset, size - offset, "%dd%d", rv->dice,
						  rv->sides);
	}

	return offset;
}